

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleParallelNoClockAnalyzer.cpp
# Opt level: O3

void __thiscall SimpleParallelAnalyzer::~SimpleParallelAnalyzer(SimpleParallelAnalyzer *this)

{
  pointer puVar1;
  pointer puVar2;
  pointer ppAVar3;
  SimpleParallelAnalyzerResults *pSVar4;
  SimpleParallelAnalyzerSettings *pSVar5;
  
  *(undefined ***)this = &PTR__SimpleParallelAnalyzer_0010ad50;
  Analyzer::KillThread();
  SimpleParallelSimulationDataGenerator::~SimpleParallelSimulationDataGenerator
            (&this->mSimulationDataGenerator);
  std::vector<Channel,_std::allocator<Channel>_>::~vector(&this->mDataChannels);
  puVar1 = (this->mDataNextEdge).
           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  puVar2 = (this->mDataMasks).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  ppAVar3 = (this->mData).
            super__Vector_base<AnalyzerChannelData_*,_std::allocator<AnalyzerChannelData_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppAVar3 != (pointer)0x0) {
    operator_delete(ppAVar3);
  }
  pSVar4 = (this->mResults)._M_ptr;
  if (pSVar4 != (SimpleParallelAnalyzerResults *)0x0) {
    (**(code **)(*(long *)pSVar4 + 8))();
  }
  pSVar5 = (this->mSettings)._M_ptr;
  if (pSVar5 != (SimpleParallelAnalyzerSettings *)0x0) {
    (**(code **)(*(long *)pSVar5 + 8))();
  }
  Analyzer::~Analyzer((Analyzer *)this);
  return;
}

Assistant:

SimpleParallelAnalyzer::~SimpleParallelAnalyzer()
{
	KillThread();
}